

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkGraphicsPipelineLibraryCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkGraphicsPipelineLibraryCreateInfoEXT>
          (Impl *this,VkGraphicsPipelineLibraryCreateInfoEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkGraphicsPipelineLibraryCreateInfoEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkGraphicsPipelineLibraryCreateInfoEXT>(alloc,count);
    if (pVVar1 != (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0) {
      pVVar1 = (VkGraphicsPipelineLibraryCreateInfoEXT *)memmove(pVVar1,src,count * 0x18);
      return pVVar1;
    }
  }
  return (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}